

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O1

void __thiscall
QNetworkAccessManagerPrivate::authenticationRequired
          (QNetworkAccessManagerPrivate *this,QAuthenticator *authenticator,QNetworkReply *reply,
          bool synchronous,QUrl *url,QUrl *urlForLastAuthentication,bool allowAuthenticationReuse)

{
  QObject *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  qsizetype qVar5;
  char cVar6;
  byte bVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QNetworkAuthenticationCredential cred;
  QString local_140;
  QString local_128;
  QString local_110;
  QArrayData *local_f8;
  storage_type_conflict *local_f0;
  long local_e8;
  QString local_e0;
  QArrayData *local_c8;
  storage_type_conflict *local_c0;
  long local_b8;
  QArrayData *local_b0 [2];
  long local_a0;
  QAuthenticator *local_98;
  QNetworkReply *local_90;
  QNetworkAuthenticationCredential local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  if ((allowAuthenticationReuse) &&
     ((cVar6 = QUrl::isEmpty(), cVar6 != '\0' ||
      (cVar6 = comparesEqual(url,urlForLastAuthentication), cVar6 == '\0')))) {
    QUrl::userName(&local_88,url,0x7f00000);
    qVar5 = local_88.domain.d.size;
    if (((QAuthenticator **)local_88.domain.d.size == (QAuthenticator **)0x0) ||
       (QUrl::password(local_b0,url,0x7f00000), local_a0 == 0)) {
      bVar3 = false;
      bVar2 = false;
      bVar7 = 0;
    }
    else {
      QUrl::userName(&local_c8,url,0x7f00000);
      QAuthenticator::user(&local_e0,authenticator);
      if ((local_b8 == local_e0.d.size) &&
         (QVar9.m_data = local_c0, QVar9.m_size = local_b8, QVar13.m_data = local_e0.d.ptr,
         QVar13.m_size = local_e0.d.size, cVar6 = QtPrivate::equalStrings(QVar9,QVar13),
         cVar6 != '\0')) {
        QUrl::password(&local_f8,url,0x7f00000);
        QAuthenticator::password(&local_110,authenticator);
        bVar3 = true;
        if (local_e8 == local_110.d.size) {
          QVar10.m_data = local_f0;
          QVar10.m_size = local_e8;
          QVar14.m_data = local_110.d.ptr;
          QVar14.m_size = local_110.d.size;
          bVar7 = QtPrivate::equalStrings(QVar10,QVar14);
          bVar7 = bVar7 ^ 1;
          bVar2 = true;
          goto LAB_001817c1;
        }
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      bVar3 = true;
      bVar7 = 1;
    }
LAB_001817c1:
    if (bVar2) {
      if (&(local_110.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_110.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_f8 != (QArrayData *)0x0) {
        LOCK();
        (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_f8,2,0x10);
        }
      }
    }
    if (bVar3) {
      if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,2,0x10);
        }
      }
    }
    if (((QAuthenticator **)qVar5 != (QAuthenticator **)0x0) && (local_b0[0] != (QArrayData *)0x0))
    {
      LOCK();
      (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0[0],2,0x10);
      }
    }
    if (&(local_88.domain.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_88.domain.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar7 == 0) {
      local_88.password.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.password.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.password.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.user.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.user.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.domain.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.user.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.domain.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.domain.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkAccessAuthenticationManager::fetchCachedCredentials
                (&local_88,
                 (this->authenticationManager).
                 super___shared_ptr<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,url,authenticator);
      bVar2 = local_88.user.d.ptr != (storage_type_conflict *)0x0;
      bVar3 = (QNetworkReply **)local_88.domain.d.ptr != (QNetworkReply **)0x0;
      bVar8 = local_88.password.d.ptr != (storage_type_conflict *)0x0;
      if ((bVar2 || bVar3) || bVar8) {
        QAuthenticator::user(&local_128,authenticator);
        bVar7 = 1;
        if ((local_88.user.d.size == local_128.d.size) &&
           (QVar11.m_data = local_88.user.d.ptr, QVar11.m_size = local_88.user.d.size,
           QVar15.m_data = local_128.d.ptr, QVar15.m_size = local_128.d.size,
           cVar6 = QtPrivate::equalStrings(QVar11,QVar15), cVar6 != '\0')) {
          QAuthenticator::password(&local_140,authenticator);
          bVar4 = true;
          if (local_88.password.d.size == local_140.d.size) {
            QVar12.m_data = local_88.password.d.ptr;
            QVar12.m_size = local_88.password.d.size;
            QVar16.m_data = local_140.d.ptr;
            QVar16.m_size = local_140.d.size;
            bVar7 = QtPrivate::equalStrings(QVar12,QVar16);
            bVar7 = bVar7 ^ 1;
          }
          else {
            bVar7 = 1;
          }
        }
        else {
          bVar4 = false;
        }
      }
      else {
        bVar4 = false;
        bVar7 = 0;
      }
      if ((bVar4) && (&(local_140.d.d)->super_QArrayData != (QArrayData *)0x0)) {
        LOCK();
        ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_140.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((bVar2 || bVar3) || bVar8) && (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0))
      {
        LOCK();
        ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (bVar7 != 0) {
        QAuthenticator::setUser(authenticator,&local_88.user);
        QAuthenticator::setPassword(authenticator,&local_88.password);
        QUrl::operator=(urlForLastAuthentication,url);
        if (&(local_88.password.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.password.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.password.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_88.password.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_88.password.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_88.user.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_88.user.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_88.domain.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_88.domain.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto LAB_00181c61;
      }
      if (&(local_88.password.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.password.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.password.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_88.password.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_88.password.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_88.user.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_88.user.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_88.domain.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_88.domain.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_00181be8;
    }
    QUrl::userName(&local_88,url,0x7f00000);
    QAuthenticator::setUser(authenticator,&local_88.domain);
    if (&(local_88.domain.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_88.domain.d.d)->super_QArrayData,2,0x10);
      }
    }
    QUrl::password(&local_88,url,0x7f00000);
    QAuthenticator::setPassword(authenticator,&local_88.domain);
    if (&(local_88.domain.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_88.domain.d.d)->super_QArrayData,2,0x10);
      }
    }
    QUrl::operator=(urlForLastAuthentication,url);
  }
  else {
LAB_00181be8:
    if (synchronous) goto LAB_00181c61;
    QUrl::operator=(urlForLastAuthentication,url);
    local_88.domain.d.ptr = (char16_t *)&local_90;
    local_88.domain.d.size = (qsizetype)&local_98;
    local_88.domain.d.d = (Data *)0x0;
    local_98 = authenticator;
    local_90 = reply;
    QMetaObject::activate(pQVar1,&QNetworkAccessManager::staticMetaObject,1,(void **)&local_88);
    if (!allowAuthenticationReuse) goto LAB_00181c61;
  }
  QNetworkAccessAuthenticationManager::cacheCredentials
            ((this->authenticationManager).
             super___shared_ptr<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,url,authenticator);
LAB_00181c61:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessManagerPrivate::authenticationRequired(QAuthenticator *authenticator,
                                                          QNetworkReply *reply,
                                                          bool synchronous,
                                                          QUrl &url,
                                                          QUrl *urlForLastAuthentication,
                                                          bool allowAuthenticationReuse)
{
    Q_Q(QNetworkAccessManager);

    // don't try the cache for the same URL twice in a row
    // being called twice for the same URL means the authentication failed
    // also called when last URL is empty, e.g. on first call
    if (allowAuthenticationReuse && (urlForLastAuthentication->isEmpty()
            || url != *urlForLastAuthentication)) {
        // if credentials are included in the url, then use them, unless they were already used
        if (!url.userName().isEmpty() && !url.password().isEmpty()
            && (url.userName() != authenticator->user()
                || url.password() != authenticator->password())) {
            authenticator->setUser(url.userName(QUrl::FullyDecoded));
            authenticator->setPassword(url.password(QUrl::FullyDecoded));
            *urlForLastAuthentication = url;
            authenticationManager->cacheCredentials(url, authenticator);
            return;
        }

        QNetworkAuthenticationCredential cred = authenticationManager->fetchCachedCredentials(url, authenticator);
        if (!cred.isNull()
            && (cred.user != authenticator->user() || cred.password != authenticator->password())) {
            authenticator->setUser(cred.user);
            authenticator->setPassword(cred.password);
            *urlForLastAuthentication = url;
            return;
        }
    }

    // if we emit a signal here in synchronous mode, the user might spin
    // an event loop, which might recurse and lead to problems
    if (synchronous)
        return;

    *urlForLastAuthentication = url;
    emit q->authenticationRequired(reply, authenticator);
    if (allowAuthenticationReuse)
        authenticationManager->cacheCredentials(url, authenticator);
}